

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

bool deqp::gls::pixelNearLineIntersection(int x,int y,Surface *target)

{
  bool bVar1;
  RGBA local_34;
  byte local_2d;
  int local_2c;
  int iStack_28;
  bool targetCoverage;
  int dx;
  int dy;
  int coveredPixels;
  Surface *target_local;
  int local_10;
  int y_local;
  int x_local;
  
  dx = 0;
  iStack_28 = -1;
  _dy = target;
  target_local._4_4_ = y;
  local_10 = x;
  do {
    if (1 < iStack_28) {
      return false;
    }
    for (local_2c = -1; local_2c < 2; local_2c = local_2c + 1) {
      local_34 = tcu::Surface::getPixel(_dy,local_10 + local_2c,target_local._4_4_ + iStack_28);
      bVar1 = isBlack(&local_34);
      local_2d = (bVar1 ^ 0xffU) & 1;
      if ((local_2d != 0) && (dx = dx + 1, 3 < dx)) {
        return true;
      }
    }
    iStack_28 = iStack_28 + 1;
  } while( true );
}

Assistant:

static bool pixelNearLineIntersection (int x, int y, const tcu::Surface& target)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	int coveredPixels = 0;

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const bool targetCoverage = !isBlack(target.getPixel(x+dx, y+dy));
		if (targetCoverage)
		{
			++coveredPixels;

			// A single thin line cannot have more than 3 covered pixels in a 3x3 area
			if (coveredPixels >= 4)
				return true;
		}
	}

	return false;
}